

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sh.cpp
# Opt level: O0

void SHRotate(rot_data_t *c_in,rot_data_t *c_out,mat4f *m,int lmax)

{
  long lVar1;
  rot_data_t *prVar2;
  float fVar3;
  mat4f *pmVar4;
  uint uVar5;
  undefined8 uStack_50;
  rot_data_t *local_48;
  ulong local_40;
  unsigned_long __vla_expr0;
  float local_30;
  float local_2c;
  float gamma;
  float beta;
  float alpha;
  int lmax_local;
  mat4f *m_local;
  rot_data_t *c_out_local;
  rot_data_t *c_in_local;
  
  uStack_50 = 0x1e1e0c;
  beta = (float)lmax;
  _alpha = m;
  m_local = (mat4f *)c_out;
  c_out_local = c_in;
  toZYZ(m,&gamma,&local_2c,&local_30);
  uStack_50 = 0x1e1e14;
  uVar5 = SHTerms((int)beta);
  prVar2 = c_out_local;
  pmVar4 = m_local;
  fVar3 = beta;
  local_40 = (ulong)uVar5;
  lVar1 = -(local_40 * 4 + 0xf & 0xfffffffffffffff0);
  local_48 = (rot_data_t *)((long)&local_48 + lVar1);
  __vla_expr0 = (unsigned_long)&local_48;
  *(undefined8 *)((long)&uStack_50 + lVar1) = 0x1e1e4f;
  SHRotateZ(prVar2,(rot_data_t *)pmVar4,local_30,(int)fVar3);
  pmVar4 = m_local;
  fVar3 = beta;
  prVar2 = local_48;
  *(undefined8 *)((long)&uStack_50 + lVar1) = 0x1e1e5f;
  SHRotateXPlus((rot_data_t *)pmVar4,prVar2,(int)fVar3);
  pmVar4 = m_local;
  fVar3 = beta;
  prVar2 = local_48;
  *(undefined8 *)((long)&uStack_50 + lVar1) = 0x1e1e74;
  SHRotateZ(prVar2,(rot_data_t *)pmVar4,local_2c,(int)fVar3);
  pmVar4 = m_local;
  fVar3 = beta;
  prVar2 = local_48;
  *(undefined8 *)((long)&uStack_50 + lVar1) = 0x1e1e84;
  SHRotateXMinus((rot_data_t *)pmVar4,prVar2,(int)fVar3);
  pmVar4 = m_local;
  fVar3 = beta;
  prVar2 = local_48;
  *(undefined8 *)((long)&uStack_50 + lVar1) = 0x1e1e99;
  SHRotateZ(prVar2,(rot_data_t *)pmVar4,gamma,(int)fVar3);
  return;
}

Assistant:

void SHRotate(const rot_data_t *c_in, rot_data_t *c_out, const mat4f &m, int lmax)
{
    float alpha, beta, gamma;
    toZYZ(m, &alpha, &beta, &gamma);
    rot_data_t work[SHTerms(lmax)];
    SHRotateZ(c_in, c_out, gamma, lmax);
    SHRotateXPlus(c_out, work, lmax);
    SHRotateZ(work, c_out, beta, lmax);
    SHRotateXMinus(c_out, work, lmax);
    SHRotateZ(work, c_out, alpha, lmax);
}